

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdflogger-c.cc
# Opt level: O2

void set_log_dest(QPDFLogger *l,function<void_(std::shared_ptr<Pipeline>)> *method,
                 qpdf_log_dest_e dest,char *identifier,qpdf_log_fn_t fn,void *udata)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this;
  qpdf_log_fn_t local_98;
  char *local_90;
  shared_ptr<Pipeline> local_88;
  QPDFLogger local_78;
  QPDFLogger local_68;
  QPDFLogger local_58;
  element_type *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_40;
  shared_ptr<Pipeline> local_38;
  _func_int_char_ptr_unsigned_long_void_ptr *local_20;
  
  local_98 = fn;
  local_90 = identifier;
  switch(dest) {
  case qpdf_log_dest_default:
    local_88.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    local_88.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::function<void_(std::shared_ptr<Pipeline>)>::operator()(method,&local_88);
    this = &local_88.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    break;
  case qpdf_log_dest_stdout:
    QPDFLogger::standardOutput(&local_58);
    std::function<void_(std::shared_ptr<Pipeline>)>::operator()
              (method,(shared_ptr<Pipeline> *)&local_58);
    this = &local_58.m.super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount;
    break;
  case qpdf_log_dest_stderr:
    QPDFLogger::standardError(&local_68);
    std::function<void_(std::shared_ptr<Pipeline>)>::operator()
              (method,(shared_ptr<Pipeline> *)&local_68);
    this = &local_68.m.super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount;
    break;
  case qpdf_log_dest_discard:
    QPDFLogger::discard(&local_78);
    std::function<void_(std::shared_ptr<Pipeline>)>::operator()
              (method,(shared_ptr<Pipeline> *)&local_78);
    this = &local_78.m.super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount;
    break;
  case qpdf_log_dest_custom:
    local_20 = (_func_int_char_ptr_unsigned_long_void_ptr *)0x0;
    std::
    make_shared<Pl_Function,char_const*&,decltype(nullptr),int(*&)(char_const*,unsigned_long,void*),void*&>
              ((char **)&local_48,&local_90,&local_20,&local_98);
    this = &_Stack_40;
    local_38.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_48;
    local_38.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Stack_40._M_pi;
    local_48 = (element_type *)0x0;
    _Stack_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::function<void_(std::shared_ptr<Pipeline>)>::operator()(method,&local_38);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_38.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    break;
  default:
    goto switchD_0020a8e7_default;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(this);
switchD_0020a8e7_default:
  return;
}

Assistant:

static void
set_log_dest(
    QPDFLogger* l,
    std::function<void(std::shared_ptr<Pipeline>)> method,
    qpdf_log_dest_e dest,
    char const* identifier,
    qpdf_log_fn_t fn,
    void* udata)
{
    switch (dest) {
    case qpdf_log_dest_default:
        method(nullptr);
        break;
    case qpdf_log_dest_stdout:
        method(l->standardOutput());
        break;
    case qpdf_log_dest_stderr:
        method(l->standardError());
        break;
    case qpdf_log_dest_discard:
        method(l->discard());
        break;
    case qpdf_log_dest_custom:
        method(std::make_shared<Pl_Function>(identifier, nullptr, fn, udata));
        break;
    }
}